

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void rehash(lua_State *L,Table *t,TValue *ek)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int local_ac;
  int totaluse;
  int i;
  uint nums [32];
  uint na;
  uint asize;
  TValue *ek_local;
  Table *t_local;
  lua_State *L_local;
  
  for (local_ac = 0; local_ac < 0x20; local_ac = local_ac + 1) {
    (&totaluse)[local_ac] = 0;
  }
  uVar1 = numusearray(t,(uint *)&totaluse);
  nums[0x1e] = uVar1;
  iVar2 = numusehash(t,(uint *)&totaluse,nums + 0x1e);
  iVar3 = countint(ek,(uint *)&totaluse);
  nums[0x1e] = iVar3 + nums[0x1e];
  nums[0x1f] = computesizes((uint *)&totaluse,nums + 0x1e);
  luaH_resize(L,t,nums[0x1f],(iVar2 + uVar1 + 1) - nums[0x1e]);
  return;
}

Assistant:

static void rehash (lua_State *L, Table *t, const TValue *ek) {
  unsigned int asize;  /* optimal size for array part */
  unsigned int na;  /* number of keys in the array part */
  unsigned int nums[MAXABITS + 1];
  int i;
  int totaluse;
  for (i = 0; i <= MAXABITS; i++) nums[i] = 0;  /* reset counts */
  na = numusearray(t, nums);  /* count keys in array part */
  totaluse = na;  /* all those keys are integer keys */
  totaluse += numusehash(t, nums, &na);  /* count keys in hash part */
  /* count extra key */
  na += countint(ek, nums);
  totaluse++;
  /* compute new size for array part */
  asize = computesizes(nums, &na);
  /* resize the table to new computed sizes */
  luaH_resize(L, t, asize, totaluse - na);
}